

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O1

pair<const_phmap::priv::NonStandardLayout,_int> * __thiscall
phmap::priv::hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::
operator()(pair<const_phmap::priv::NonStandardLayout,_int> *__return_storage_ptr__,
          Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *this)

{
  result_type_conflict1 rVar1;
  mt19937_64 *__urng;
  Generator<phmap::priv::NonStandardLayout,_void> local_49;
  param_type local_48;
  NonStandardLayout local_40;
  
  Generator<phmap::priv::NonStandardLayout,_void>::operator()(&local_40,&local_49);
  local_48._M_a = 0;
  local_48._M_b = 0x7fffffff;
  __urng = GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_48,__urng,&local_48);
  (__return_storage_ptr__->first)._vptr_NonStandardLayout =
       (_func_int **)&PTR__NonStandardLayout_0034b120;
  (__return_storage_ptr__->first).value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).value.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->first).value,local_40.value._M_dataplus._M_p,
             local_40.value._M_dataplus._M_p + local_40.value._M_string_length);
  __return_storage_ptr__->second = rVar1;
  local_40._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_0034b120;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.value._M_dataplus._M_p != &local_40.value.field_2) {
    operator_delete(local_40.value._M_dataplus._M_p,local_40.value.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }